

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YuvImageProcessor.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  ISAType IVar2;
  bool bVar3;
  FILE *__stream;
  void *pvVar4;
  clock_t cVar5;
  clock_t cVar6;
  long *plVar7;
  int iVar8;
  long *plVar9;
  clock_t start;
  int iVar10;
  long lVar11;
  ofstream out;
  allocator local_2b1;
  long *local_2b0;
  long local_2a8;
  long local_2a0;
  long lStack_298;
  long *local_290;
  long local_288;
  long local_280;
  long lStack_278;
  long *local_270;
  long local_268;
  long local_260;
  long lStack_258;
  undefined1 *local_250 [2];
  undefined1 local_240 [16];
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  bVar3 = parsePara(argc,argv);
  if (bVar3) {
    __stream = fopen(file_name,"r");
    iVar8 = size + 3;
    if (-1 < size) {
      iVar8 = size;
    }
    iVar10 = -1;
    if (-1 < size) {
      iVar10 = size;
    }
    iVar8 = iVar8 >> 2;
    if (size < -3) {
      iVar8 = -1;
    }
    lVar11 = 0;
    do {
      pvVar4 = operator_new__((long)iVar10);
      *(void **)((long)result[0] + lVar11) = pvVar4;
      pvVar4 = operator_new__((long)iVar8);
      *(void **)((long)result[0] + lVar11 + 8) = pvVar4;
      pvVar4 = operator_new__((long)iVar8);
      *(void **)((long)result[0] + lVar11 + 0x10) = pvVar4;
      lVar11 = lVar11 + 0x18;
    } while (lVar11 != 0x7f8);
    fread(y,1,0x1fa400,__stream);
    fread(u,1,0x7e900,__stream);
    fread(v,1,0x7e900,__stream);
    fclose(__stream);
    IVar2 = isa;
    cVar5 = clock();
    if (IVar2 == BASIC) {
      BasicProcessor();
    }
    else if (IVar2 == MMX) {
      MMXProcessor();
    }
    else if (IVar2 == SSE2) {
      SSE2Processor();
    }
    else {
      AVXProcessor();
    }
    cVar6 = clock();
    auVar1 = SEXT816(cVar6 - cVar5) * SEXT816(0x20c49ba5e353f7cf);
    printf("%s:\t%dms\n",ISAName[isa],
           (ulong)(uint)((int)(auVar1._8_8_ >> 7) - (auVar1._12_4_ >> 0x1f)));
    std::__cxx11::string::string((string *)local_250,file_name,&local_2b1);
    plVar7 = (long *)std::__cxx11::string::append((char *)local_250);
    plVar9 = plVar7 + 2;
    if ((long *)*plVar7 == plVar9) {
      local_2a0 = *plVar9;
      lStack_298 = plVar7[3];
      local_2b0 = &local_2a0;
    }
    else {
      local_2a0 = *plVar9;
      local_2b0 = (long *)*plVar7;
    }
    local_2a8 = plVar7[1];
    *plVar7 = (long)plVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2b0);
    plVar9 = plVar7 + 2;
    if ((long *)*plVar7 == plVar9) {
      local_280 = *plVar9;
      lStack_278 = plVar7[3];
      local_290 = &local_280;
    }
    else {
      local_280 = *plVar9;
      local_290 = (long *)*plVar7;
    }
    local_288 = plVar7[1];
    *plVar7 = (long)plVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_290);
    plVar9 = plVar7 + 2;
    if ((long *)*plVar7 == plVar9) {
      local_260 = *plVar9;
      lStack_258 = plVar7[3];
      local_270 = &local_260;
    }
    else {
      local_260 = *plVar9;
      local_270 = (long *)*plVar7;
    }
    local_268 = plVar7[1];
    *plVar7 = (long)plVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::ofstream::ofstream(&local_230,(string *)&local_270,_S_out);
    if (local_270 != &local_260) {
      operator_delete(local_270);
    }
    if (local_290 != &local_280) {
      operator_delete(local_290);
    }
    if (local_2b0 != &local_2a0) {
      operator_delete(local_2b0);
    }
    if (local_250[0] != local_240) {
      operator_delete(local_250[0]);
    }
    lVar11 = 0;
    do {
      std::ostream::write((char *)&local_230,*(long *)((long)result[0] + lVar11));
      std::ostream::write((char *)&local_230,*(long *)((long)result[0] + lVar11 + 8));
      std::ostream::write((char *)&local_230,*(long *)((long)result[0] + lVar11 + 0x10));
      lVar11 = lVar11 + 0x18;
    } while (lVar11 != 0x7f8);
    std::ofstream::close();
    lVar11 = 0;
    do {
      operator_delete(*(void **)((long)result[0] + lVar11));
      operator_delete(*(void **)((long)result[0] + lVar11 + 8));
      operator_delete(*(void **)((long)result[0] + lVar11 + 0x10));
      lVar11 = lVar11 + 0x18;
    } while (lVar11 != 0x7f8);
    local_230 = _VTT;
    *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _fclose;
    std::filebuf::~filebuf(local_228);
    std::ios_base::~ios_base(local_138);
    return 0;
  }
  printUsage();
  exit(-1);
}

Assistant:

int main(int argc, char *argv[]) {
    if (!parsePara(argc, argv)) {
        printUsage();
        exit(-1);
    }

    FILE *reader = fopen(file_name, "r");

    for (auto &i : result) {
        i[0] = new char[size];
        i[1] = new char[size / 4];
        i[2] = new char[size / 4];
    }

    fread(y, 1, width * height, reader);
    fread(u, 1, width / 2 * height / 2, reader);
    fread(v, 1, width / 2 * height / 2, reader);
    fclose(reader);

    int interval;
    if (isa == BASIC) {
        auto start = clock();
        BasicProcessor();
        auto end = clock();
        interval = (end - start) * 1000 / CLOCKS_PER_SEC;
    } else if (isa == MMX) {
        auto start = clock();
        MMXProcessor();
        auto end = clock();
        interval = (end - start) * 1000 / CLOCKS_PER_SEC;
    } else if (isa == SSE2) {
        auto start = clock();
        SSE2Processor();
        auto end = clock();
        interval = (end - start) * 1000 / CLOCKS_PER_SEC;

    } else {
        auto start = clock();
        AVXProcessor();
        auto end = clock();
        interval = (end - start) * 1000 / CLOCKS_PER_SEC;
    }
    printf("%s:\t%dms\n", ISAName[isa], interval);

    std::ofstream out(std::string(file_name) + "." + ISAName[isa] + ".yuv");
    for (auto &i : result) {
        out.write(i[0], size);
        out.write(i[1], size / 4);
        out.write(i[2], size / 4);
    }
    out.close();

    for (auto &i : result) {
        delete i[0];
        delete i[1];
        delete i[2];
    }
}